

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::unary_op_reciprocal<float>>(Mat *a,Option *opt)

{
  size_t sVar1;
  float *pfVar2;
  Mat *in_RDI;
  float fVar3;
  int i;
  int size;
  unary_op_reciprocal<float> op;
  int local_1c;
  unary_op_reciprocal<float> local_11 [9];
  Mat *local_8;
  
  local_8 = in_RDI;
  sVar1 = Mat::total(in_RDI);
  for (local_1c = 0; local_1c < (int)sVar1; local_1c = local_1c + 1) {
    pfVar2 = Mat::operator[](local_8,local_1c);
    fVar3 = unary_op_reciprocal<float>::operator()(local_11,pfVar2);
    pfVar2 = Mat::operator[](local_8,local_1c);
    *pfVar2 = fVar3;
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int size = a.total();

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i=0; i<size; i++)
    {
        a[i] = op(a[i]);
    }

    return 0;
}